

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CCEXP.hpp
# Opt level: O0

void CCEXP::LoadTable<float>(CCEXP *obj,char *name,char *type)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this;
  FILE *__stream;
  ulong new_elements_;
  bool bVar1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  __shared_ptr<CCEXP::CCEXPBase,_(__gnu_cxx::_Lock_policy)2> *p_Var5;
  CCEXPMat<float> *this_00;
  unsigned_long *puVar6;
  float *pfVar7;
  char *local_310;
  char *local_308;
  char *local_2e8;
  char *local_2e0;
  char *local_2b8;
  char *local_2b0;
  char *local_2a8;
  char *local_2a0;
  char *local_288;
  char *local_280;
  char *local_278;
  char *local_270;
  uint64_t columns;
  uint64_t row;
  uint64_t maxCols;
  MVECTOR<float> rowData;
  MVECTOR<unsigned_long> DPL;
  undefined1 local_1c0 [4];
  int ret;
  size_t local_1b0;
  size_t idx;
  CCEXPMat<float> *U;
  uint64_t c_1;
  uint64_t TableBytes_1;
  MVECTOR<unsigned_long> DPL_2;
  uint64_t i_1;
  uint64_t c;
  uint64_t TableBytes;
  undefined1 local_128 [8];
  MVECTOR<unsigned_long> DPL_1;
  uint64_t i;
  ulong uStack_d8;
  bool TableFound;
  uint64_t MaxRows;
  uint64_t LastTablePosByte;
  uint64_t N;
  uint64_t typeSize;
  char loadType [64];
  char loadName [64];
  FILE *lfp;
  int prevStatus;
  char *type_local;
  char *name_local;
  CCEXP *obj_local;
  
  obj->ErrorId = 0;
  if ((obj->isActive & 1U) != 0) {
    iVar2 = obj->Status;
    obj->Status = 2;
    if ((iVar2 == 0) || (iVar2 == 1)) {
      __stream = (FILE *)obj->lfp;
      if (__stream == (FILE *)0x0) {
        pcVar3 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/terablade2001[P]CCEXP/C++/test/../src/include/CCEXP.hpp"
                         ,0x2f);
        if (pcVar3 == (char *)0x0) {
          pcVar3 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/terablade2001[P]CCEXP/C++/test/../src/include/CCEXP.hpp"
                           ,0x5c);
          if (pcVar3 == (char *)0x0) {
            local_288 = 
            "/workspace/llm4binary/github/license_all_cmakelists_25/terablade2001[P]CCEXP/C++/test/../src/include/CCEXP.hpp"
            ;
          }
          else {
            local_288 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/terablade2001[P]CCEXP/C++/test/../src/include/CCEXP.hpp"
                                ,0x5c);
            local_288 = local_288 + 1;
          }
          local_280 = local_288;
        }
        else {
          local_280 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/terablade2001[P]CCEXP/C++/test/../src/include/CCEXP.hpp"
                              ,0x2f);
          local_280 = local_280 + 1;
        }
        CECS::RecError((CECS *)CCEXPECS,-9999,1,local_280,0x21c,
                       "[%s]: LoadTable():: File pointer is NULL. Use CCEXP::Open() first!",
                       obj->SavingFile);
      }
      else {
        memset(loadType + 0x38,0,0x40);
        memset(&typeSize,0,0x40);
        N = 0;
        LastTablePosByte = 0;
        MaxRows = 0;
        uStack_d8 = 0;
        bVar1 = false;
        for (DPL_1.sptr.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)obj->LoadTableIndex;
            DPL_1.sptr.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi < (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)obj->LoadTotalTables;
            DPL_1.sptr.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    ((long)&(DPL_1.sptr.
                             super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi)->_vptr__Sp_counted_base + 1)) {
          MaxRows = ftell(__stream);
          fread(loadType + 0x38,1,0x40,__stream);
          fread(&typeSize,1,0x40,__stream);
          fread(&N,8,1,__stream);
          fread(&LastTablePosByte,8,1,__stream);
          fread(&stack0xffffffffffffff28,8,1,__stream);
          if (uStack_d8 < LastTablePosByte) {
            LastTablePosByte = uStack_d8;
          }
          iVar2 = strcmp(loadType + 0x38,name);
          if (iVar2 == 0) {
            bVar1 = true;
            obj->LoadTableIndex =
                 (size_t)((long)&(DPL_1.sptr.
                                  super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount._M_pi)->_vptr__Sp_counted_base + 1);
            break;
          }
          ns_MVECTOR::MVECTOR<unsigned_long>::MVECTOR((MVECTOR<unsigned_long> *)local_128);
          ns_MVECTOR::MVECTOR<unsigned_long>::resize
                    ((MVECTOR<unsigned_long> *)local_128,LastTablePosByte);
          puVar6 = ns_MVECTOR::MVECTOR<unsigned_long>::data((MVECTOR<unsigned_long> *)local_128);
          fread(puVar6,8,LastTablePosByte,__stream);
          c = 0;
          for (i_1 = 0; i_1 < LastTablePosByte; i_1 = i_1 + 1) {
            puVar6 = ns_MVECTOR::MVECTOR<unsigned_long>::operator[]
                               ((MVECTOR<unsigned_long> *)local_128,i_1);
            c = *puVar6 * N + c;
          }
          fseek(__stream,c,1);
          ns_MVECTOR::MVECTOR<unsigned_long>::~MVECTOR((MVECTOR<unsigned_long> *)local_128);
        }
        if (!bVar1) {
          fseek(__stream,0xc,0);
          for (DPL_2.sptr.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              DPL_2.sptr.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi < (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)obj->LoadTableIndex;
              DPL_2.sptr.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                      ((long)&(DPL_2.sptr.
                               super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi)->_vptr__Sp_counted_base + 1)) {
            MaxRows = ftell(__stream);
            fread(loadType + 0x38,1,0x40,__stream);
            fread(&typeSize,1,0x40,__stream);
            fread(&N,8,1,__stream);
            fread(&LastTablePosByte,8,1,__stream);
            fread(&stack0xffffffffffffff28,8,1,__stream);
            if (uStack_d8 < LastTablePosByte) {
              LastTablePosByte = uStack_d8;
            }
            iVar2 = strcmp(loadType + 0x38,name);
            if (iVar2 == 0) {
              bVar1 = true;
              obj->LoadTableIndex =
                   (size_t)((long)&(DPL_2.sptr.
                                    super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_refcount._M_pi)->_vptr__Sp_counted_base + 1);
              break;
            }
            ns_MVECTOR::MVECTOR<unsigned_long>::MVECTOR((MVECTOR<unsigned_long> *)&TableBytes_1);
            ns_MVECTOR::MVECTOR<unsigned_long>::resize
                      ((MVECTOR<unsigned_long> *)&TableBytes_1,LastTablePosByte);
            puVar6 = ns_MVECTOR::MVECTOR<unsigned_long>::data
                               ((MVECTOR<unsigned_long> *)&TableBytes_1);
            fread(puVar6,8,LastTablePosByte,__stream);
            c_1 = 0;
            for (U = (CCEXPMat<float> *)0x0; U < LastTablePosByte;
                U = (CCEXPMat<float> *)((long)&(U->super_CCEXPBase)._vptr_CCEXPBase + 1)) {
              puVar6 = ns_MVECTOR::MVECTOR<unsigned_long>::operator[]
                                 ((MVECTOR<unsigned_long> *)&TableBytes_1,(size_t)U);
              c_1 = *puVar6 * N + c_1;
            }
            fseek(__stream,c_1,1);
            ns_MVECTOR::MVECTOR<unsigned_long>::~MVECTOR((MVECTOR<unsigned_long> *)&TableBytes_1);
          }
        }
        if (bVar1) {
          iVar2 = strcmp((char *)&typeSize,type);
          if (iVar2 == 0) {
            sVar4 = CCEXP::checkDuplicatedNames(obj,name);
            if (sVar4 == 0) {
              this_00 = (CCEXPMat<float> *)operator_new(0xb8);
              CCEXPMat<float>::CCEXPMat(this_00);
              std::shared_ptr<CCEXP::CCEXPBase>::shared_ptr<CCEXP::CCEXPBase,void>
                        ((shared_ptr<CCEXP::CCEXPBase> *)local_1c0,(CCEXPBase *)this_00);
              ns_MVECTOR::MVECTOR<std::shared_ptr<CCEXP::CCEXPBase>_>::push_back
                        (&obj->M,(shared_ptr<CCEXP::CCEXPBase> *)local_1c0);
              std::shared_ptr<CCEXP::CCEXPBase>::~shared_ptr
                        ((shared_ptr<CCEXP::CCEXPBase> *)local_1c0);
              sVar4 = ns_MVECTOR::MVECTOR<std::shared_ptr<CCEXP::CCEXPBase>_>::size(&obj->M);
              p_Var5 = &ns_MVECTOR::MVECTOR<std::shared_ptr<CCEXP::CCEXPBase>_>::operator[]
                                  (&obj->M,sVar4 - 1)->
                        super___shared_ptr<CCEXP::CCEXPBase,_(__gnu_cxx::_Lock_policy)2>;
              idx = (size_t)std::__shared_ptr<CCEXP::CCEXPBase,_(__gnu_cxx::_Lock_policy)2>::get
                                      (p_Var5);
            }
            else {
              local_1b0 = CCEXP::getTableIndexByName(obj,name);
              p_Var5 = &ns_MVECTOR::MVECTOR<std::shared_ptr<CCEXP::CCEXPBase>_>::operator[]
                                  (&obj->M,local_1b0)->
                        super___shared_ptr<CCEXP::CCEXPBase,_(__gnu_cxx::_Lock_policy)2>;
              idx = (size_t)std::__shared_ptr<CCEXP::CCEXPBase,_(__gnu_cxx::_Lock_policy)2>::get
                                      (p_Var5);
              (*((element_type *)idx)->_vptr_CCEXPBase[0xf])();
            }
            iVar2 = CCEXPMat<float>::Initialize
                              ((CCEXPMat<float> *)idx,loadType + 0x38,(char *)&typeSize,uStack_d8,
                               obj);
            if (iVar2 == 0) {
              this = &rowData.sptr.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              ;
              ns_MVECTOR::MVECTOR<unsigned_long>::MVECTOR((MVECTOR<unsigned_long> *)this);
              ns_MVECTOR::MVECTOR<unsigned_long>::resize
                        ((MVECTOR<unsigned_long> *)this,LastTablePosByte);
              puVar6 = ns_MVECTOR::MVECTOR<unsigned_long>::data
                                 ((MVECTOR<unsigned_long> *)
                                  &rowData.sptr.
                                   super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                                 );
              fread(puVar6,8,LastTablePosByte,__stream);
              ns_MVECTOR::MVECTOR<float>::MVECTOR((MVECTOR<float> *)&maxCols);
              row = 0;
              for (columns = 0; columns < LastTablePosByte; columns = columns + 1) {
                puVar6 = ns_MVECTOR::MVECTOR<unsigned_long>::operator[]
                                   ((MVECTOR<unsigned_long> *)
                                    &rowData.sptr.
                                     super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
                                     _M_refcount,columns);
                new_elements_ = *puVar6;
                if (row < new_elements_) {
                  ns_MVECTOR::MVECTOR<float>::resize((MVECTOR<float> *)&maxCols,new_elements_);
                  row = new_elements_;
                }
                pfVar7 = ns_MVECTOR::MVECTOR<float>::data((MVECTOR<float> *)&maxCols);
                fread(pfVar7,4,new_elements_,__stream);
                sVar4 = idx;
                pfVar7 = ns_MVECTOR::MVECTOR<float>::data((MVECTOR<float> *)&maxCols);
                iVar2 = CCEXPMat<float>::AddRow((CCEXPMat<float> *)sVar4,pfVar7,new_elements_);
                if (iVar2 != 0) {
                  pcVar3 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/terablade2001[P]CCEXP/C++/test/../src/include/CCEXP.hpp"
                                   ,0x2f);
                  if (pcVar3 == (char *)0x0) {
                    pcVar3 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/terablade2001[P]CCEXP/C++/test/../src/include/CCEXP.hpp"
                                     ,0x5c);
                    if (pcVar3 == (char *)0x0) {
                      local_310 = 
                      "/workspace/llm4binary/github/license_all_cmakelists_25/terablade2001[P]CCEXP/C++/test/../src/include/CCEXP.hpp"
                      ;
                    }
                    else {
                      local_310 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/terablade2001[P]CCEXP/C++/test/../src/include/CCEXP.hpp"
                                          ,0x5c);
                      local_310 = local_310 + 1;
                    }
                    local_308 = local_310;
                  }
                  else {
                    local_308 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/terablade2001[P]CCEXP/C++/test/../src/include/CCEXP.hpp"
                                        ,0x2f);
                    local_308 = local_308 + 1;
                  }
                  CECS::RecError((CECS *)CCEXPECS,-9999,1,local_308,0x273,
                                 "[%s]: LoadTable():: Internal error occured while copying Table\'s [%s], row [%zu] from an opened file!"
                                 ,obj->SavingFile,name,columns);
                  goto LAB_0014661e;
                }
              }
              (**(code **)(*(long *)idx + 0x30))();
              if (obj->LoadTotalTables <= obj->LoadTableIndex) {
                obj->LoadTableIndex = 0;
                fseek(__stream,0xc,0);
              }
              obj->Status = 1;
LAB_0014661e:
              ns_MVECTOR::MVECTOR<float>::~MVECTOR((MVECTOR<float> *)&maxCols);
              ns_MVECTOR::MVECTOR<unsigned_long>::~MVECTOR
                        ((MVECTOR<unsigned_long> *)
                         &rowData.sptr.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
            }
            else {
              pcVar3 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/terablade2001[P]CCEXP/C++/test/../src/include/CCEXP.hpp"
                               ,0x2f);
              if (pcVar3 == (char *)0x0) {
                pcVar3 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/terablade2001[P]CCEXP/C++/test/../src/include/CCEXP.hpp"
                                 ,0x5c);
                if (pcVar3 == (char *)0x0) {
                  local_2e8 = 
                  "/workspace/llm4binary/github/license_all_cmakelists_25/terablade2001[P]CCEXP/C++/test/../src/include/CCEXP.hpp"
                  ;
                }
                else {
                  local_2e8 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/terablade2001[P]CCEXP/C++/test/../src/include/CCEXP.hpp"
                                      ,0x5c);
                  local_2e8 = local_2e8 + 1;
                }
                local_2e0 = local_2e8;
              }
              else {
                local_2e0 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/terablade2001[P]CCEXP/C++/test/../src/include/CCEXP.hpp"
                                    ,0x2f);
                local_2e0 = local_2e0 + 1;
              }
              CECS::RecError((CECS *)CCEXPECS,-9999,1,local_2e0,0x268,
                             "[%s]: LoadTable():: Internal error occured while copying Table [%s] from an opened file!"
                             ,obj->SavingFile,name);
            }
          }
          else {
            fseek(__stream,MaxRows,0);
            pcVar3 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/terablade2001[P]CCEXP/C++/test/../src/include/CCEXP.hpp"
                             ,0x2f);
            if (pcVar3 == (char *)0x0) {
              pcVar3 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/terablade2001[P]CCEXP/C++/test/../src/include/CCEXP.hpp"
                               ,0x5c);
              if (pcVar3 == (char *)0x0) {
                local_2b8 = 
                "/workspace/llm4binary/github/license_all_cmakelists_25/terablade2001[P]CCEXP/C++/test/../src/include/CCEXP.hpp"
                ;
              }
              else {
                local_2b8 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/terablade2001[P]CCEXP/C++/test/../src/include/CCEXP.hpp"
                                    ,0x5c);
                local_2b8 = local_2b8 + 1;
              }
              local_2b0 = local_2b8;
            }
            else {
              local_2b0 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/terablade2001[P]CCEXP/C++/test/../src/include/CCEXP.hpp"
                                  ,0x2f);
              local_2b0 = local_2b0 + 1;
            }
            CECS::RecError((CECS *)CCEXPECS,-9999,1,local_2b0,600,
                           "[%s]: LoadTable():: Table [%s] is of \"%s\" type, while requested LoadTable is of \"%s\" type!"
                           ,obj->SavingFile,name,&typeSize,type);
          }
        }
        else {
          fseek(__stream,MaxRows,0);
          pcVar3 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/terablade2001[P]CCEXP/C++/test/../src/include/CCEXP.hpp"
                           ,0x2f);
          if (pcVar3 == (char *)0x0) {
            pcVar3 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/terablade2001[P]CCEXP/C++/test/../src/include/CCEXP.hpp"
                             ,0x5c);
            if (pcVar3 == (char *)0x0) {
              local_2a8 = 
              "/workspace/llm4binary/github/license_all_cmakelists_25/terablade2001[P]CCEXP/C++/test/../src/include/CCEXP.hpp"
              ;
            }
            else {
              local_2a8 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/terablade2001[P]CCEXP/C++/test/../src/include/CCEXP.hpp"
                                  ,0x5c);
              local_2a8 = local_2a8 + 1;
            }
            local_2a0 = local_2a8;
          }
          else {
            local_2a0 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/terablade2001[P]CCEXP/C++/test/../src/include/CCEXP.hpp"
                                ,0x2f);
            local_2a0 = local_2a0 + 1;
          }
          CECS::RecError((CECS *)CCEXPECS,-9999,1,local_2a0,0x252,
                         "[%s]: LoadTable():: Failed to find table [%s] into the last opened file!",
                         obj->SavingFile,name);
        }
      }
    }
    else {
      pcVar3 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/terablade2001[P]CCEXP/C++/test/../src/include/CCEXP.hpp"
                       ,0x2f);
      if (pcVar3 == (char *)0x0) {
        pcVar3 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/terablade2001[P]CCEXP/C++/test/../src/include/CCEXP.hpp"
                         ,0x5c);
        if (pcVar3 == (char *)0x0) {
          local_278 = 
          "/workspace/llm4binary/github/license_all_cmakelists_25/terablade2001[P]CCEXP/C++/test/../src/include/CCEXP.hpp"
          ;
        }
        else {
          local_278 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/terablade2001[P]CCEXP/C++/test/../src/include/CCEXP.hpp"
                              ,0x5c);
          local_278 = local_278 + 1;
        }
        local_270 = local_278;
      }
      else {
        local_270 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/terablade2001[P]CCEXP/C++/test/../src/include/CCEXP.hpp"
                            ,0x2f);
        local_270 = local_270 + 1;
      }
      CECS::RecError((CECS *)CCEXPECS,-9999,1,local_270,0x21a,
                     "[%s]: LoadTable():: CCEXP object has wrong status!",obj->SavingFile);
    }
  }
  return;
}

Assistant:

inline void LoadTable(CCEXP &obj, const char* name, const char* type) {
	obj.ErrorId = 0;
	if (!obj.isActive) return;
	int prevStatus = obj.Status;
	// If any error occurs, then it should be critical error!
	obj.Status = CCEXPORTMAT_ACTIVE;
	CECS_ERR(CCEXPECS,(prevStatus != CCEXPORTMAT_INIT) && (prevStatus != CCEXPORTMAT_READY),"[%s]: LoadTable():: CCEXP object has wrong status!", obj.SavingFile);
	FILE* lfp = obj.lfp;
	CECS_ERR(CCEXPECS,lfp == NULL,"[%s]: LoadTable():: File pointer is NULL. Use CCEXP::Open() first!", obj.SavingFile);
	char loadName[64]={0};
	char loadType[64]={0};
	uint64_t typeSize=0;
	uint64_t N=0;
	uint64_t LastTablePosByte = 0;
	uint64_t MaxRows=0;
	bool TableFound = false;
	// Search from current LoadTableIndex to the Total Tables of files.
	for (uint64_t i = obj.LoadTableIndex; i < obj.LoadTotalTables; i++) {
		LastTablePosByte = ftell(lfp);
		fread(loadName,sizeof(char),64,lfp);
		fread(loadType,sizeof(char),64,lfp);
		fread(&typeSize,sizeof(uint64_t),1,lfp);
		fread(&N,sizeof(uint64_t),1,lfp);
		fread(&MaxRows,sizeof(uint64_t),1,lfp);
		if (N > MaxRows) N = MaxRows;
		if (strcmp(loadName,name)==0) {
			TableFound = true; obj.LoadTableIndex = i+1; break;
		}
		MVECTOR<uint64_t> DPL; DPL.resize(N);
		fread(DPL.data(), sizeof(uint64_t), N, lfp);
		uint64_t TableBytes = 0;
		for (uint64_t c = 0; c < N; c++)
			TableBytes += DPL[c]*typeSize;
		fseek(lfp, (long)TableBytes, SEEK_CUR);
	}
	if (!TableFound) {
		// If the Table has not been found in the file, search again from the start
		fseek(lfp, sizeof(uint32_t) + sizeof(uint64_t), SEEK_SET);

		for (uint64_t i = 0; i < obj.LoadTableIndex; i++) {
			LastTablePosByte = ftell(lfp);
			fread(loadName,sizeof(char),64,lfp);
			fread(loadType,sizeof(char),64,lfp);
			fread(&typeSize,sizeof(uint64_t),1,lfp);
			fread(&N,sizeof(uint64_t),1,lfp);
			fread(&MaxRows,sizeof(uint64_t),1,lfp);
			if (N > MaxRows) N = MaxRows;
			if (strcmp(loadName,name)==0) {
				TableFound = true; obj.LoadTableIndex = i+1; break;
			}
			MVECTOR<uint64_t> DPL; DPL.resize(N);
			fread(DPL.data(), sizeof(uint64_t), N, lfp);
			uint64_t TableBytes = 0;
			for (uint64_t c = 0; c < N; c++)
				TableBytes += DPL[c]*typeSize;
			fseek(lfp, (long)TableBytes, SEEK_CUR);
		}
	}

	// If the Table hot not been found, then abort with error.
	if(!TableFound) {
		fseek(lfp, (long)LastTablePosByte, SEEK_SET);
		CECS_ERR(CCEXPECS,1, "[%s]: LoadTable():: Failed to find table [%s] into the last opened file!", obj.SavingFile, name);
	}

	// At this point the table has been found, and we have to reload it!
	if (strcmp(loadType, type) != 0) {
		fseek(lfp, (long)LastTablePosByte, SEEK_SET);
		CECS_ERR(CCEXPECS,1,"[%s]: LoadTable():: Table [%s] is of \"%s\" type, while requested LoadTable is of \"%s\" type!", obj.SavingFile, name, loadType, type);
	}

	CCEXPMat<T> *U;
	if (obj.checkDuplicatedNames(name) > 0) { // If the table already exist!
		size_t idx = obj.getTableIndexByName(name);
		U = static_cast<CCEXPMat<T>*>(obj.M[idx].get());
		U->Reset();
	}
	else
	{// If the table does not exist create a new Table...
		obj.M.push_back(shared_ptr<CCEXPBase>((CCEXPBase*) new CCEXPMat<T>));
		U = static_cast<CCEXPMat<T>*>(obj.M[obj.M.size()-1].get());
	}

	int ret = U->Initialize(loadName, loadType, MaxRows, &obj);
	CECS_ERR(CCEXPECS,ret != 0,"[%s]: LoadTable():: Internal error occured while copying Table [%s] from an opened file!", obj.SavingFile, name);
	// Copy data from file to the new table.
	MVECTOR<uint64_t> DPL; DPL.resize(N);
	fread(DPL.data(), sizeof(uint64_t), N, lfp);
	MVECTOR<T> rowData;
	uint64_t maxCols=0;
	for (uint64_t row = 0; row < N; row++) {
		const uint64_t columns = DPL[row];
		if (columns > maxCols) { maxCols = columns; rowData.resize(maxCols); }
		fread(rowData.data(), sizeof(T), columns, lfp);
		ret = U->AddRow(rowData.data(), columns);
		CECS_ERR(CCEXPECS,ret != 0,"[%s]: LoadTable():: Internal error occured while copying Table's [%s], row [" __ZU__ "] from an opened file!", obj.SavingFile, name, (size_t)row);
	}
	// Warning: newRowFlag should be set to false, thus use to be able
	// add data directly to the end of the last row if he want.
	U->NoNewRow();

	if (obj.LoadTableIndex >= obj.LoadTotalTables) {
		obj.LoadTableIndex = 0;
		fseek(lfp, sizeof(uint32_t) + sizeof(uint64_t), SEEK_SET);
	}

	obj.Status = CCEXPORTMAT_READY;
}